

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall
google::protobuf::util::Status::Status(Status *this,Code error_code,StringPiece error_message)

{
  string local_48;
  Code local_24;
  Status *pSStack_20;
  Code error_code_local;
  Status *this_local;
  StringPiece error_message_local;
  
  error_message_local.ptr_ = (char *)error_message.length_;
  this_local = (Status *)error_message.ptr_;
  this->error_code_ = error_code;
  local_24 = error_code;
  pSStack_20 = this;
  std::__cxx11::string::string((string *)&this->error_message_);
  if (local_24 != OK) {
    StringPiece::ToString_abi_cxx11_(&local_48,(StringPiece *)&this_local);
    std::__cxx11::string::operator=((string *)&this->error_message_,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

Status::Status(error::Code error_code, StringPiece error_message)
    : error_code_(error_code) {
  if (error_code != error::OK) {
    error_message_ = error_message.ToString();
  }
}